

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_add_integer_into_shifted_by_words(mp_int *r,mp_int *a,uintmax_t n,size_t word_index)

{
  uint uVar1;
  ulong uVar2;
  uintmax_t uVar3;
  BignumInt BVar4;
  ulong uVar5;
  BignumInt BVar6;
  BignumDblInt ADC_temp;
  BignumInt out;
  BignumInt aword;
  uintmax_t new_n;
  BignumInt bword;
  size_t i;
  BignumCarry carry;
  uint indicator;
  size_t word_index_local;
  uintmax_t n_local;
  mp_int *a_local;
  mp_int *r_local;
  
  carry._4_4_ = 0;
  i = 0;
  word_index_local = n;
  for (bword = 0; bword < r->nw; bword = bword + 1) {
    uVar1 = normalise_to_1(bword ^ word_index);
    carry._4_4_ = uVar1 ^ 1 | carry._4_4_;
    uVar2 = word_index_local & -(ulong)carry._4_4_;
    uVar3 = shift_right_by_one_word(word_index_local);
    word_index_local = (word_index_local ^ uVar3) & -(ulong)carry._4_4_ ^ word_index_local;
    BVar4 = mp_word(a,bword);
    uVar5 = BVar4 + uVar2;
    BVar6 = uVar5 + i;
    i = (ulong)CARRY8(BVar4,uVar2) + (ulong)CARRY8(uVar5,i);
    r->w[bword] = BVar6;
  }
  return;
}

Assistant:

static void mp_add_integer_into_shifted_by_words(
    mp_int *r, mp_int *a, uintmax_t n, size_t word_index)
{
    unsigned indicator = 0;
    BignumCarry carry = 0;

    for (size_t i = 0; i < r->nw; i++) {
        /* indicator becomes 1 when we reach the index that the least
         * significant bits of n want to be placed at, and it stays 1
         * thereafter. */
        indicator |= 1 ^ normalise_to_1(i ^ word_index);

        /* If indicator is 1, we add the low bits of n into r, and
         * shift n down. If it's 0, we add zero bits into r, and
         * leave n alone. */
        BignumInt bword = n & -(BignumInt)indicator;
        uintmax_t new_n = shift_right_by_one_word(n);
        n ^= (n ^ new_n) & -(uintmax_t)indicator;

        BignumInt aword = mp_word(a, i);
        BignumInt out;
        BignumADC(out, carry, aword, bword, carry);
        r->w[i] = out;
    }
}